

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseOutputCommand(WastParser *this,CommandPtr *param_1)

{
  Result RVar1;
  TokenType TVar2;
  string text;
  Location loc;
  Location local_d8;
  Var var;
  Var local_68;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar1 = Expect(this,Output);
  if (RVar1.enum_ != Error) {
    Error(this,0x1ef38e);
    text.field_2._M_allocated_capacity._0_4_ = 0;
    text.field_2._4_8_ = 0;
    text._M_dataplus._M_p = (pointer)0x0;
    text._M_string_length._0_4_ = 0;
    text._M_string_length._4_4_ = 0;
    Var::Var(&var,0xffffffff,(Location *)&text);
    text._M_dataplus._M_p = (pointer)&text.field_2;
    text._M_string_length._0_4_ = 0;
    text._M_string_length._4_4_ = 0;
    text.field_2._M_allocated_capacity._0_4_ = text.field_2._M_allocated_capacity._0_4_ & 0xffffff00
    ;
    local_d8.field_1.field_0.line = 0;
    local_d8.field_1._4_8_ = 0;
    local_d8.filename.data_ = (char *)0x0;
    local_d8.filename.size_._0_4_ = 0;
    local_d8.filename.size_._4_4_ = 0;
    Var::Var(&local_68,0xffffffff,&local_d8);
    ParseVarOpt(this,&var,&local_68);
    Var::~Var(&local_68);
    TVar2 = Peek(this,0);
    if ((TVar2 != Text) || (RVar1 = ParseQuotedText(this,&text), RVar1.enum_ != Error)) {
      Expect(this,Rpar);
    }
    std::__cxx11::string::_M_dispose();
    Var::~Var(&var);
    return (Result)Error;
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseOutputCommand(CommandPtr*) {
  // Parse the output command, but always fail since this command is not
  // actually supported.
  WABT_TRACE(ParseOutputCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Output);
  Error(loc, "output command is not supported");
  Var var;
  std::string text;
  ParseVarOpt(&var);
  if (Peek() == TokenType::Text) {
    CHECK_RESULT(ParseQuotedText(&text));
  }
  EXPECT(Rpar);
  return Result::Error;
}